

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

void __thiscall module_level_csv_actions::begin(module_level_csv_actions *this)

{
  ostream *poVar1;
  module_level_csv_actions *this_local;
  
  if (s_csv_table_marker) {
    std::operator<<((ostream *)&std::cout,"[Levels]\n");
  }
  if ((s_csv_table_header & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Level");
    poVar1 = std::operator<<(poVar1,(string *)&s_csv_separator_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,"Module");
    poVar1 = std::operator<<(poVar1,(string *)&s_csv_separator_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,"Dependencies");
    std::operator<<(poVar1,"\n");
  }
  return;
}

Assistant:

void begin()
    {
        if( s_csv_table_marker )
            std::cout << "[Levels]\n";
        if( s_csv_table_header )
            std::cout << "Level" << s_csv_separator << "Module" << s_csv_separator << "Dependencies" << "\n";
    }